

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O2

void __thiscall
TPZTransfer<std::complex<float>_>::TPZTransfer(TPZTransfer<std::complex<float>_> *this,void **vtt)

{
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  *(undefined4 *)&(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.field_0x1c = 0;
  TPZBlock::TPZBlock(&this->fRowBlock);
  TPZBlock::TPZBlock(&this->fColBlock);
  TPZVec<int>::TPZVec(&this->fColPosition,0);
  TPZVec<int>::TPZVec(&this->fNumberofColumnBlocks,0);
  TPZManVector<int,_10>::TPZManVector(&this->fColumnBlockPosition,0);
  TPZManVector<int,_10>::TPZManVector(&this->fColumnBlockNumber,0);
  this->fColumnBlockLastUsed = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_016505e0;
  (this->fDoubleValues).fExtAlloc[0]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[1]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[2]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[3]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[4]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[5]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[6]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[7]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[8]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[9]._M_value = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore = (this->fDoubleValues).fExtAlloc;
  this->fDoubleValLastUsed = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNElements = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNAlloc = 0;
  return;
}

Assistant:

TPZTransfer<TVar>::TPZTransfer() : TPZRegisterClassId(&TPZTransfer::ClassId),
fNTVarVar(0),fRowBlock(),fColBlock(),fColPosition(0),fNumberofColumnBlocks(0),fColumnBlockPosition(0),
fColumnBlockNumber(0),fColumnBlockLastUsed(0),fDoubleValues(0),fDoubleValLastUsed(0) {
}